

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_api.hpp
# Opt level: O0

double __thiscall hrgls::StreamProperties::Rate(StreamProperties *this)

{
  bool bVar1;
  mapped_type mVar2;
  element_type *peVar3;
  element_type *peVar4;
  mapped_type *pmVar5;
  key_type local_20;
  double local_18;
  double ret;
  StreamProperties *this_local;
  
  ret = (double)this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  if (bVar1) {
    peVar3 = std::
             __shared_ptr_access<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    peVar4 = std::__shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2> *)peVar3)
    ;
    mVar2 = hrgls_StreamPropertiesGetRate(peVar4,&local_18);
    peVar3 = std::
             __shared_ptr_access<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    local_20._M_thread = (native_handle_type)std::this_thread::get_id();
    pmVar5 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[](&peVar3->m_status,&local_20);
    *pmVar5 = mVar2;
  }
  return local_18;
}

Assistant:

double StreamProperties::Rate()
  {
    double ret;
    if (m_private) {
      m_private->m_status[std::this_thread::get_id()] = hrgls_StreamPropertiesGetRate(m_private->m_state.get(), &ret);
    }

    return ret;
  }